

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::ReleaseDecommitted
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,void *address,size_t pageCount,
          void *segmentParam)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (pageCount <=
      (this->
      super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ).maxAllocPageCount) {
    TrackDecommittedPages(this,address,(uint)pageCount,segmentParam);
    return;
  }
  if (*(void **)((long)segmentParam + 0x10) != address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa11,"(address == segment->GetAddress())",
                       "address == segment->GetAddress()");
    if (!bVar2) goto LAB_0066e4e0;
    *puVar3 = 0;
  }
  if (*(long *)((long)segmentParam + 0x18) - (ulong)*(uint *)((long)segmentParam + 0x28) !=
      pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa12,"(pageCount == segment->GetAvailablePageCount())",
                       "pageCount == segment->GetAvailablePageCount()");
    if (!bVar2) {
LAB_0066e4e0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ReleaseDecommittedSegment(this,(SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
  return;
}

Assistant:

void
HeapPageAllocator<T>::ReleaseDecommitted(void * address, size_t pageCount, __in void *  segmentParam)
{
    SegmentBase<T> * segment = (SegmentBase<T>*) segmentParam;
    if (pageCount > this->maxAllocPageCount)
    {
        Assert(address == segment->GetAddress());
        Assert(pageCount == segment->GetAvailablePageCount());
        this->ReleaseDecommittedSegment(segment);
    }
    else
    {
        Assert(pageCount <= UINT_MAX);
        this->TrackDecommittedPages(address, (uint)pageCount, (PageSegment *)segment);
    }
}